

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
* google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::Wrap(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
        CustomModel_CustomModelParamValue *value,Arena *arena)

{
  MapEntryWrapper *this;
  Arena *arena_local;
  CustomModel_CustomModelParamValue *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  MapEntryWrapper *local_68;
  Arena *local_60;
  MapEntryWrapper *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  undefined8 local_48;
  Arena *local_40;
  MapEntryWrapper *local_38;
  MapEntryWrapper *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  Arena **local_20;
  byte local_11;
  Arena *local_10;
  
  if (arena == (Arena *)0x0) {
    local_68 = (MapEntryWrapper *)operator_new(0x40);
    MapEntryWrapper::MapEntryWrapper(local_68,(Arena *)0x0,key,value);
  }
  else {
    local_48 = 0;
    local_58 = (MapEntryWrapper *)value;
    local_50 = key;
    local_40 = arena;
    local_11 = Arena::
               SkipDeleteList<google::protobuf::internal::MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::MessageLite,std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>::MapEntryWrapper>
                         ((DestructorSkippable_ *)0x0);
    local_20 = &local_60;
    local_28 = local_50;
    t = local_58;
    local_60 = arena;
    local_10 = arena;
    this = (MapEntryWrapper *)
           Arena::AllocateAligned
                     (arena,(type_info *)
                            &MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::MessageLite,std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>
                             ::MapEntryWrapper::typeinfo,0x40);
    MapEntryWrapper::MapEntryWrapper(this,*local_20,local_28,(CustomModel_CustomModelParamValue *)t)
    ;
    local_38 = this;
    if ((local_11 & 1) == 0) {
      Arena::AddListNode(arena,this,
                         arena_destruct_object<google::protobuf::internal::MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>,google::protobuf::MessageLite,std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)11,0>::MapEntryWrapper>
                        );
    }
    local_68 = local_38;
  }
  return &local_68->
          super_MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
}

Assistant:

static Derived* Wrap(const Key& key, const Value& value, Arena* arena) {
    return Arena::CreateMessage<MapEntryWrapper>(arena, key, value);
  }